

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

void duckdb::QuantileOperation::
     ConstantOperation<double,duckdb::QuantileState<double,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<double,true>>
               (QuantileState<double,_duckdb::QuantileStandardType> *state,double *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  bool bVar1;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    Operation<double,duckdb::QuantileState<double,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<double,true>>
              (state,input,unary_input);
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}